

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O1

XXH32_hash_t ZSTD_XXH32_digest(XXH32_state_t *state)

{
  xxh_u32 xVar1;
  XXH_alignment in_ECX;
  int iVar2;
  
  if (state->large_len == 0) {
    iVar2 = state->v[2] + 0x165667b1;
  }
  else {
    in_ECX = (state->v[1] << 7 | state->v[1] >> 0x19) +
             (state->v[0] << 1 | (uint)((int)state->v[0] < 0));
    iVar2 = (state->v[3] << 0x12 | state->v[3] >> 0xe) + (state->v[2] << 0xc | state->v[2] >> 0x14)
            + in_ECX;
  }
  xVar1 = XXH32_finalize(iVar2 + state->total_len_32,(xxh_u8 *)state->mem32,(ulong)state->memsize,
                         in_ECX);
  return xVar1;
}

Assistant:

XXH_PUBLIC_API XXH32_hash_t XXH32_digest(const XXH32_state_t* state)
{
    xxh_u32 h32;

    if (state->large_len) {
        h32 = XXH_rotl32(state->v[0], 1)
            + XXH_rotl32(state->v[1], 7)
            + XXH_rotl32(state->v[2], 12)
            + XXH_rotl32(state->v[3], 18);
    } else {
        h32 = state->v[2] /* == seed */ + XXH_PRIME32_5;
    }

    h32 += state->total_len_32;

    return XXH32_finalize(h32, (const xxh_u8*)state->mem32, state->memsize, XXH_aligned);
}